

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::ImmediatePromiseNode<kj::_::Void>::ImmediatePromiseNode
          (ImmediatePromiseNode<kj::_::Void> *this,ExceptionOr<kj::_::Void> *result)

{
  ImmediatePromiseNodeBase::ImmediatePromiseNodeBase(&this->super_ImmediatePromiseNodeBase);
  (this->super_ImmediatePromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_0062df80;
  Maybe<kj::Exception>::Maybe((Maybe<kj::Exception> *)&this->result,(Maybe<kj::Exception> *)result);
  (this->result).value.ptr.isSet = (result->value).ptr.isSet;
  if ((result->value).ptr.isSet == true) {
    (result->value).ptr.isSet = false;
  }
  return;
}

Assistant:

ImmediatePromiseNode(ExceptionOr<T>&& result): result(kj::mv(result)) {}